

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O0

uint8_t * __thiscall pktalloc::Allocator::Allocate(Allocator *this,uint bytes)

{
  Allocator *pAVar1;
  uint uVar2;
  int iVar3;
  int in_ESI;
  long in_RDI;
  uint8_t *data;
  uint fullCount;
  AllocationHeader *regionHeader;
  uint8_t *region;
  uint regionEnd;
  uint regionStart;
  UsedMaskT *usedPtr;
  WindowHeader *window;
  int i;
  uint preferredCount;
  uint units;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa8;
  long *plVar4;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  Allocator *in_stack_ffffffffffffffb8;
  int local_38;
  uint8_t *local_20;
  
  if (in_ESI == 0) {
    local_20 = (uint8_t *)0x0;
  }
  else {
    uVar2 = (in_ESI + 0x1fU >> 5) + 1;
    if (uVar2 < 0x201) {
      local_38 = *(int *)(in_RDI + 0xd0);
LAB_00259cbb:
      local_38 = local_38 + -1;
      if (-1 < local_38) {
        pAVar1 = *(Allocator **)(*(long *)(in_RDI + 0xd8) + (long)local_38 * 8);
        if (uVar2 <= *(uint *)((pAVar1->FullWindows).PreallocatedData + 3)) {
          in_stack_ffffffffffffffb4 = *(uint *)((long)(pAVar1->FullWindows).PreallocatedData + 0x1c)
          ;
          in_stack_ffffffffffffffb8 = pAVar1;
          while (in_stack_ffffffffffffffb4 < 0x800) {
            in_stack_ffffffffffffffb4 =
                 CustomBitSet<2048U>::FindFirstClear
                           ((CustomBitSet<2048U> *)in_stack_ffffffffffffffb8,
                            in_stack_ffffffffffffffb4);
            in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb4 + uVar2;
            if (0x800 < in_stack_ffffffffffffffb0) break;
            in_stack_ffffffffffffffb0 =
                 CustomBitSet<2048U>::FindFirstSet
                           ((CustomBitSet<2048U> *)in_stack_ffffffffffffffb8,
                            in_stack_ffffffffffffffb4 + 1,in_stack_ffffffffffffffb0);
            if (uVar2 <= in_stack_ffffffffffffffb0 - in_stack_ffffffffffffffb4) {
              iVar3 = in_stack_ffffffffffffffb4 + uVar2;
              plVar4 = (long *)((long)(pAVar1->FullWindows).PreallocatedData +
                               (ulong)(in_stack_ffffffffffffffb4 << 5) + 0x38);
              *plVar4 = (long)pAVar1;
              *(uint *)(plVar4 + 1) = uVar2;
              *(uint *)((pAVar1->FullWindows).PreallocatedData + 3) =
                   *(int *)((pAVar1->FullWindows).PreallocatedData + 3) - uVar2;
              CustomBitSet<2048U>::SetRange
                        ((CustomBitSet<2048U> *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffb4 + uVar2);
              *(uint *)((long)(pAVar1->FullWindows).PreallocatedData + 0x1c) =
                   in_stack_ffffffffffffffb4 + uVar2;
              moveLastFewWindowsToFull
                        ((Allocator *)CONCAT44(in_stack_ffffffffffffffb4,iVar3),
                         (uint)((ulong)plVar4 >> 0x20));
              return (uint8_t *)(plVar4 + 4);
            }
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb0 + 1;
          }
        }
        goto LAB_00259cbb;
      }
      moveLastFewWindowsToFull
                ((Allocator *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      local_20 = allocateFromNewWindow(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    }
    else {
      local_20 = fallbackAllocate((Allocator *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                  (uint)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    }
  }
  return local_20;
}

Assistant:

uint8_t* Allocator::Allocate(unsigned bytes)
{
    if (bytes <= 0) {
        return nullptr;
    }

    ALLOC_DEBUG_INTEGRITY_CHECK();

    // Calculate number of units required by this allocation
    // Note: +1 for the AllocationHeader
    const unsigned units = (bytes + kUnitSize - 1) / kUnitSize + 1;

    if (units > kFallbackThresholdUnits) {
        return fallbackAllocate(bytes);
    }

    // Check preferred windows list:
    const unsigned preferredCount = PreferredWindows.GetSize();
    for (int i = (int)preferredCount - 1; i >= 0; --i)
    {
        WindowHeader* window = PreferredWindows.GetRef(i);
        PKTALLOC_DEBUG_ASSERT(window);

        if (window->FreeUnitCount < units) {
            continue;
        }

        // Walk the holes in the bitmask:
        UsedMaskT* usedPtr = &window->Used;
        unsigned regionStart = window->ResumeScanOffset;
        while (regionStart < UsedMaskT::kValidBits)
        {
            regionStart = usedPtr->FindFirstClear(regionStart);
            unsigned regionEnd = regionStart + units;

            // If we ran out of space:
            if (regionEnd > UsedMaskT::kValidBits) {
                break;
            }

            regionEnd = usedPtr->FindFirstSet(regionStart + 1, regionEnd);
            PKTALLOC_DEBUG_ASSERT(regionEnd > regionStart);
            PKTALLOC_DEBUG_ASSERT(regionEnd <= UsedMaskT::kValidBits);

            if (regionEnd - regionStart < units)
            {
                regionStart = regionEnd + 1;
                continue;
            }
            regionEnd = regionStart + units;

            // Carve out region
            uint8_t* region = (uint8_t*)window + kWindowHeaderBytes + regionStart * kUnitSize;
            AllocationHeader* regionHeader = (AllocationHeader*)region;
#ifdef PKTALLOC_DEBUG
            regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
            regionHeader->Header = window;
            regionHeader->UsedUnits = units;

            // Update window header
#ifdef PKTALLOC_SHRINK
            if (window->FreeUnitCount >= kWindowMaxUnits &&
                !window->Preallocated)
            {
                PKTALLOC_DEBUG_ASSERT(EmptyWindowCount > 0);
                --EmptyWindowCount;
            }
#endif // PKTALLOC_SHRINK
            window->FreeUnitCount -= units;
            usedPtr->SetRange(regionStart, regionStart + units);
            window->ResumeScanOffset = regionStart + units;

            // Any prior windows that failed to allocate are moved to full list
            unsigned fullCount = preferredCount - 1 - i;

            // Move this window to the full list if we cannot make another allocation of the same size
            if (regionStart + units * 2 > kWindowMaxUnits) {
                // Include this one too
                ++fullCount;
            }

            moveLastFewWindowsToFull(fullCount);

            uint8_t* data = region + kUnitSize;
#ifdef PKTALLOC_SCRUB_MEMORY
            memset(data, 0, (units - 1) * kUnitSize);
#endif // PKTALLOC_SCRUB_MEMORY
            PKTALLOC_DEBUG_ASSERT((uintptr_t)data % kUnitSize == 0);
            PKTALLOC_DEBUG_ASSERT((uint8_t*)regionHeader >= (uint8_t*)regionHeader->Header + kWindowHeaderBytes);
            PKTALLOC_DEBUG_ASSERT(regionHeader->GetUnitStart() < kWindowMaxUnits);
            PKTALLOC_DEBUG_ASSERT(regionHeader->GetUnitStart() + regionHeader->UsedUnits <= kWindowMaxUnits);
            return data;
        }
    }

    // Move all preferred windows to full since none of them worked out
    moveLastFewWindowsToFull(preferredCount);

    return allocateFromNewWindow(units);
}